

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O2

size_t ON_SubDMeshFragment::SizeofFragment(uint display_density)

{
  uint uVar1;
  
  if ((display_density < 7) &&
     (uVar1 = SideSegmentCountFromDisplayDensity(display_density), uVar1 != 0)) {
    return (ulong)((uVar1 + 1) * (uVar1 + 1) * 0x60 + 0x248);
  }
  ON_SubDIncrementErrorCount();
  return 0;
}

Assistant:

size_t ON_SubDMeshFragment::SizeofFragment(
  unsigned int display_density
)
{
  if (display_density > ON_SubDDisplayParameters::MaximumDensity)
    return ON_SUBD_RETURN_ERROR(0);

  const unsigned side_seg_count = ON_SubDMeshFragment::SideSegmentCountFromDisplayDensity(display_density);
  if (side_seg_count < 1)
    return ON_SUBD_RETURN_ERROR(0);

  const unsigned vertex_capacity = (side_seg_count + 1)*(side_seg_count + 1);
  size_t sz = sizeof(ON_SubDMeshFragment);
  while (0 != (sz % sizeof(double)))
    ++sz;

  const size_t doubles_per_vertex
    = 3 // 3d points in m_P[]
    + 3 // 3d vectors in m_N[]
    + 3 // 3d points in m_T[]
    + 1 // a color in m_C[] (note that sizeof(m_C[0]) <= sizeof(double)
    + sizeof(ON_SurfaceCurvature)/sizeof(double) // 2 doubles in ON_SurfaceCurvature
    ;

  const size_t sizeof_doubles = doubles_per_vertex * sizeof(double);
  sz += vertex_capacity * sizeof_doubles;
  return sz;
}